

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultIOSystem.cpp
# Opt level: O2

bool __thiscall Assimp::DefaultIOSystem::Exists(DefaultIOSystem *this,char *pFile)

{
  FILE *__stream;
  
  __stream = fopen(pFile,"rb");
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  return __stream != (FILE *)0x0;
}

Assistant:

bool DefaultIOSystem::Exists(const char* pFile) const
{
#ifdef _WIN32
    struct __stat64 filestat;
    if (_wstat64(Utf8ToWide(pFile).c_str(), &filestat) != 0) {
        return false;
    }
#else
    FILE* file = ::fopen(pFile, "rb");
    if (!file)
        return false;

    ::fclose(file);
#endif
    return true;
}